

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_context * ggml_init(ggml_init_params params)

{
  int iVar1;
  ggml_context *pgVar2;
  void *pvVar3;
  void *pvVar4;
  int i;
  long lVar5;
  float *pfVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  timespec ts;
  timespec local_68;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  pvVar4 = params.mem_buffer;
  while( true ) {
    LOCK();
    iVar1 = g_state_barrier + 1;
    UNLOCK();
    if (g_state_barrier < 1) break;
    LOCK();
    UNLOCK();
    sched_yield();
  }
  g_state_barrier = iVar1;
  if (ggml_init_is_first_call != '\x01') {
    clock_gettime(1,&local_68);
    pfVar6 = table_f32_f16;
    local_58 = 0x80000000;
    uStack_54 = 0x80000000;
    uStack_50 = 0x80000000;
    uStack_4c = 0x80000000;
    lVar5 = 0;
    do {
      local_48 = vcvtph2ps_f16c(ZEXT416((uint)lVar5));
      *pfVar6 = local_48._0_4_;
      auVar13._0_8_ = (double)local_48._0_4_;
      auVar13._8_8_ = local_48._8_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auVar13._0_8_ * 0.044715;
      auVar8 = vfmadd213sd_fma(auVar11,auVar13,ZEXT816(0x3ff0000000000000));
      dVar7 = tanh(auVar13._0_8_ * 0.7978845608028654 * auVar8._0_8_);
      dVar7 = (dVar7 + 1.0) * auVar13._0_8_ * 0.5;
      auVar8._0_4_ = (float)dVar7;
      auVar8._4_4_ = (int)((ulong)dVar7 >> 0x20);
      auVar8._8_8_ = 0;
      auVar8 = vcvtps2ph_f16c(auVar8,0);
      vpextrw_avx(auVar8,0);
      dVar7 = exp((double)(float)(local_48._0_4_ ^ local_58));
      dVar7 = auVar13._0_8_ / (dVar7 + 1.0);
      auVar12._0_4_ = (float)dVar7;
      auVar12._4_4_ = (int)((ulong)dVar7 >> 0x20);
      auVar12._8_8_ = 0;
      auVar8 = vcvtps2ph_f16c(auVar12,0);
      vpextrw_avx(auVar8,0);
      auVar10._0_8_ = exp(auVar13._0_8_);
      auVar10._8_56_ = extraout_var;
      auVar9._0_4_ = (float)auVar10._0_8_;
      auVar9._4_12_ = auVar10._4_12_;
      auVar8 = vcvtps2ph_f16c(auVar9,0);
      vpextrw_avx(auVar8,0);
      lVar5 = lVar5 + 1;
      pfVar6 = pfVar6 + 1;
    } while (lVar5 != 0x10000);
    clock_gettime(1,&local_68);
    clock_gettime(1,&local_68);
    lVar5 = 0;
    memset(&g_state,0,0x1800);
    do {
      (&g_state.contexts[0].used)[lVar5] = false;
      lVar5 = lVar5 + 0x60;
    } while (lVar5 != 0x1800);
    clock_gettime(1,&local_68);
    ggml_init_is_first_call = '\x01';
  }
  pgVar2 = (ggml_context *)0x0;
  lVar5 = 0;
  do {
    if ((&g_state.contexts[0].used)[lVar5] == false) {
      (&g_state.contexts[0].used)[lVar5] = true;
      pvVar3 = pvVar4;
      if (pvVar4 == (void *)0x0) {
        pvVar3 = malloc(params.mem_size);
      }
      pgVar2 = (ggml_context *)((long)&g_state.contexts[0].context.mem_size + lVar5);
      pgVar2->mem_size = params.mem_size;
      *(void **)((long)&g_state.contexts[0].context.mem_buffer + lVar5) = pvVar3;
      *(bool *)(lVar5 + 0x1e4858) = pvVar4 == (void *)0x0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch.size + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch.data + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.offs + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.size + lVar5 + 1) = 0;
      *(undefined8 *)(&g_state.contexts[0].context.field_0x11 + lVar5) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.objects_begin + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.objects_end + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch.offs + lVar5 + 1) = 0;
      *(undefined8 *)((long)&g_state.contexts[0].context.scratch_save.data + lVar5) = 0;
      break;
    }
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0x1800);
  LOCK();
  g_state_barrier = g_state_barrier + -1;
  UNLOCK();
  return pgVar2;
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    // make this function thread safe
    ggml_critical_section_start();

    static bool is_first_call = true;

    if (is_first_call) {
        // initialize GELU, SILU and EXP F32 tables
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            ggml_fp16_t ii;
            for (int i = 0; i < (1 << 16); ++i) {
                uint16_t ui = i;
                memcpy(&ii, &ui, sizeof(ii));
                const float f = table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(ii);
                table_gelu_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_f32(f));
                table_silu_f16[i] = GGML_FP32_TO_FP16(ggml_silu_f32(f));
                table_exp_f16[i]  = GGML_FP32_TO_FP16(exp(f));
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: GELU, SILU and EXP tables initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        // initialize g_state
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            g_state = (struct ggml_state) {
                /*.contexts =*/ { { 0 } },
            };

            for (int i = 0; i < GGML_MAX_CONTEXTS; ++i) {
                g_state.contexts[i].used = false;
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: g_state initialized in %f ms\n", __func__, (t_end - t_start)/1000.0f);
        }

        is_first_call = false;
    }

    // find non-used context in g_state
    struct ggml_context * ctx = NULL;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (!g_state.contexts[i].used) {
            g_state.contexts[i].used = true;
            ctx = &g_state.contexts[i].context;

            GGML_PRINT_DEBUG("%s: found unused context %d\n", __func__, i);
            break;
        }
    }

    if (ctx == NULL) {
        GGML_PRINT_DEBUG("%s: no unused context found\n", __func__);

        ggml_critical_section_end();

        return NULL;
    }

    *ctx = (struct ggml_context) {
        /*.mem_size         =*/ params.mem_size,
        /*.mem_buffer       =*/ params.mem_buffer ? params.mem_buffer : malloc(params.mem_size),
        /*.mem_buffer_owned =*/ params.mem_buffer ? false : true,
        /*.n_objects        =*/ 0,
        /*.objects_begin    =*/ NULL,
        /*.objects_end      =*/ NULL,
        /*.scratch          =*/ { 0, 0, NULL, },
        /*.scratch_save     =*/ { 0, 0, NULL, },
    };

    ggml_assert_aligned(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    ggml_critical_section_end();

    return ctx;
}